

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmTargetTraceDependencies::CheckCustomCommands
          (cmTargetTraceDependencies *this,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands)

{
  pointer pcVar1;
  cmCustomCommand *command;
  pointer cc;
  
  pcVar1 = (commands->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (cc = (commands->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
            _M_impl.super__Vector_impl_data._M_start; cc != pcVar1; cc = cc + 1) {
    CheckCustomCommand(this,cc);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::CheckCustomCommands(
  const std::vector<cmCustomCommand>& commands)
{
  for (cmCustomCommand const& command : commands) {
    this->CheckCustomCommand(command);
  }
}